

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Perseus.cpp
# Opt level: O1

void __thiscall Perseus::BackupStageLeadOut(Perseus *this,GaoVectorSet *Gao)

{
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *pmVar1;
  size_type sVar2;
  _func_int *p_Var3;
  pointer pcVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long *plVar8;
  size_type *psVar9;
  uint uVar10;
  ulong uVar11;
  string local_68;
  long *local_48 [2];
  long local_38 [2];
  
  lVar5 = *(long *)((long)&this->_m_verbose + (long)this->_vptr_Perseus[-3]);
  if (lVar5 == 0) {
    lVar5 = *(long *)((long)&this->_m_bestValue + (long)this->_vptr_Perseus[-3]);
  }
  lVar5 = (**(code **)(**(long **)(lVar5 + 0x30) + 0x68))();
  if (lVar5 != 0) {
    uVar11 = 0;
    do {
      lVar5 = *(long *)((long)&this->_m_verbose + (long)this->_vptr_Perseus[-3]);
      if (lVar5 == 0) {
        lVar5 = *(long *)((long)&this->_m_bestValue + (long)this->_vptr_Perseus[-3]);
      }
      lVar5 = (**(code **)(**(long **)(lVar5 + 0x30) + 200))();
      if (lVar5 != 0) {
        uVar10 = 1;
        uVar7 = 0;
        do {
          pmVar1 = (Gao->
                   super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                   ).
                   super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                   .base_[(Gao->
                          super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                          ).
                          super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                          .origin_offset_ +
                          (Gao->
                          super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                          ).
                          super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                          .stride_list_.elems[0] * uVar11 +
                          uVar7 * (Gao->
                                  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                                  ).
                                  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                                  .stride_list_.elems[1]];
          if (pmVar1 != (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                         *)0x0) {
            sVar2 = (pmVar1->data_).size_;
            if (sVar2 != 0) {
              operator_delete((pmVar1->data_).data_,sVar2 << 3);
            }
            operator_delete(pmVar1,0x28);
          }
          lVar5 = *(long *)((long)&this->_m_verbose + (long)this->_vptr_Perseus[-3]);
          if (lVar5 == 0) {
            lVar5 = *(long *)((long)&this->_m_bestValue + (long)this->_vptr_Perseus[-3]);
          }
          uVar7 = (ulong)uVar10;
          uVar6 = (**(code **)(**(long **)(lVar5 + 0x30) + 200))();
          uVar10 = uVar10 + 1;
        } while (uVar6 != uVar7);
      }
      lVar5 = *(long *)((long)&this->_m_verbose + (long)this->_vptr_Perseus[-3]);
      if (lVar5 == 0) {
        lVar5 = *(long *)((long)&this->_m_bestValue + (long)this->_vptr_Perseus[-3]);
      }
      uVar11 = (ulong)((int)uVar11 + 1);
      uVar7 = (**(code **)(**(long **)(lVar5 + 0x30) + 0x68))();
    } while (uVar7 != uVar11);
  }
  p_Var3 = this->_vptr_Perseus[-3];
  pcVar4 = (this->_m_identification)._M_dataplus._M_p;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar4,pcVar4 + (this->_m_identification)._M_string_length);
  plVar8 = (long *)std::__cxx11::string::append((char *)local_48);
  psVar9 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_68.field_2._M_allocated_capacity = *psVar9;
    local_68.field_2._8_8_ = plVar8[3];
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  }
  else {
    local_68.field_2._M_allocated_capacity = *psVar9;
    local_68._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_68._M_string_length = plVar8[1];
  *plVar8 = (long)psVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  TimedAlgorithm::StopTimer((TimedAlgorithm *)((long)&this->_vptr_Perseus + (long)p_Var3),&local_68)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return;
}

Assistant:

void Perseus::BackupStageLeadOut(GaoVectorSet Gao) const
{
    // release the memory of the back-projected vectors
    for(unsigned int a=0;a!=GetPU()->GetNrJointActions();a++)
        for(unsigned int o=0;o!=GetPU()->GetNrJointObservations();o++)
            delete(Gao[a][o]);
    
    StopTimer(GetIdentification() + "BackupStage");
}